

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMIntersectorKMoeller<4,_8,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  Scene *pSVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  undefined1 auVar6 [32];
  ulong uVar7;
  undefined1 auVar8 [16];
  byte bVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  ulong *puVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  vint4 bi;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  vint4 ai;
  undefined1 auVar26 [32];
  undefined1 auVar27 [16];
  undefined1 auVar28 [64];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [64];
  undefined1 auVar32 [16];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  float fVar36;
  float fVar38;
  float fVar39;
  float fVar40;
  undefined1 auVar37 [64];
  undefined1 auVar41 [16];
  uint uVar43;
  uint uVar44;
  uint uVar45;
  undefined1 auVar42 [64];
  undefined1 auVar46 [16];
  undefined1 auVar47 [64];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  ulong *local_b78;
  RTCFilterFunctionNArguments local_b10;
  undefined1 local_ae0 [32];
  undefined1 local_ab0 [16];
  undefined1 local_aa0 [16];
  undefined1 local_a90 [16];
  undefined1 local_a80 [16];
  undefined1 local_a70 [16];
  undefined1 local_a60 [16];
  undefined1 local_a50 [16];
  undefined1 local_a40 [16];
  undefined1 local_a30 [16];
  undefined1 local_a20 [16];
  undefined4 local_a10;
  undefined4 uStack_a0c;
  undefined4 uStack_a08;
  undefined4 uStack_a04;
  undefined1 local_a00 [16];
  undefined1 local_9f0 [16];
  undefined1 local_9e0 [16];
  undefined1 local_9d0 [16];
  undefined1 local_9b0 [16];
  float local_9a0 [4];
  undefined1 local_990 [16];
  float local_980 [4];
  undefined1 local_970 [16];
  undefined1 local_960 [16];
  undefined1 local_950 [16];
  undefined1 local_940 [32];
  RTCHitN local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined4 local_8a0;
  undefined4 uStack_89c;
  undefined4 uStack_898;
  undefined4 uStack_894;
  undefined4 uStack_890;
  undefined4 uStack_88c;
  undefined4 uStack_888;
  undefined4 uStack_884;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  uint local_840;
  uint uStack_83c;
  uint uStack_838;
  uint uStack_834;
  uint uStack_830;
  uint uStack_82c;
  uint uStack_828;
  uint uStack_824;
  uint local_820;
  uint uStack_81c;
  uint uStack_818;
  uint uStack_814;
  uint uStack_810;
  uint uStack_80c;
  uint uStack_808;
  uint uStack_804;
  size_t local_800;
  ulong local_7f8 [249];
  
  local_800 = root.ptr;
  fVar36 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_a30._4_4_ = fVar36;
  local_a30._0_4_ = fVar36;
  local_a30._8_4_ = fVar36;
  local_a30._12_4_ = fVar36;
  auVar28 = ZEXT1664(local_a30);
  fVar38 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_a40._4_4_ = fVar38;
  local_a40._0_4_ = fVar38;
  local_a40._8_4_ = fVar38;
  local_a40._12_4_ = fVar38;
  auVar31 = ZEXT1664(local_a40);
  fVar39 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  local_a50._4_4_ = fVar39;
  local_a50._0_4_ = fVar39;
  local_a50._8_4_ = fVar39;
  local_a50._12_4_ = fVar39;
  auVar33 = ZEXT1664(local_a50);
  fVar36 = fVar36 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar38 = fVar38 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar39 = fVar39 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  uVar19 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar21 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar20 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  local_a60._0_8_ = CONCAT44(fVar36,fVar36) ^ 0x8000000080000000;
  local_a60._8_4_ = -fVar36;
  local_a60._12_4_ = -fVar36;
  auVar35 = ZEXT1664(local_a60);
  local_a70._0_8_ = CONCAT44(fVar38,fVar38) ^ 0x8000000080000000;
  local_a70._8_4_ = -fVar38;
  local_a70._12_4_ = -fVar38;
  auVar37 = ZEXT1664(local_a70);
  local_a10 = 0x80000000;
  uStack_a0c = 0x80000000;
  uStack_a08 = 0x80000000;
  uStack_a04 = 0x80000000;
  local_a80._0_8_ = CONCAT44(fVar39,fVar39) ^ 0x8000000080000000;
  local_a80._8_4_ = -fVar39;
  local_a80._12_4_ = -fVar39;
  auVar34 = ZEXT1664(local_a80);
  iVar10 = (tray->tnear).field_0.i[k];
  local_a90._4_4_ = iVar10;
  local_a90._0_4_ = iVar10;
  local_a90._8_4_ = iVar10;
  local_a90._12_4_ = iVar10;
  auVar42 = ZEXT1664(local_a90);
  iVar10 = (tray->tfar).field_0.i[k];
  local_aa0._4_4_ = iVar10;
  local_aa0._0_4_ = iVar10;
  local_aa0._8_4_ = iVar10;
  local_aa0._12_4_ = iVar10;
  auVar47 = ZEXT1664(local_aa0);
  iVar10 = 1 << ((uint)k & 0x1f);
  auVar23._4_4_ = iVar10;
  auVar23._0_4_ = iVar10;
  auVar23._8_4_ = iVar10;
  auVar23._12_4_ = iVar10;
  auVar23._16_4_ = iVar10;
  auVar23._20_4_ = iVar10;
  auVar23._24_4_ = iVar10;
  auVar23._28_4_ = iVar10;
  auVar6 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar23 = vpand_avx2(auVar23,auVar6);
  local_940 = vpcmpeqd_avx2(auVar23,auVar6);
  local_a20._8_4_ = 0x7fffffff;
  local_a20._0_8_ = 0x7fffffff7fffffff;
  local_a20._12_4_ = 0x7fffffff;
  local_b78 = local_7f8;
LAB_015de97d:
  do {
    puVar18 = local_b78;
    if (puVar18 == &local_800) {
LAB_015deffd:
      return puVar18 != &local_800;
    }
    local_b78 = puVar18 + -1;
    uVar12 = puVar18[-1];
    while ((uVar12 & 8) == 0) {
      auVar8 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar12 + 0x20 + uVar19),auVar35._0_16_,
                               auVar28._0_16_);
      auVar52 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar12 + 0x20 + uVar21),auVar37._0_16_,
                                auVar31._0_16_);
      auVar8 = vpmaxsd_avx(auVar8,auVar52);
      auVar52 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar12 + 0x20 + uVar20),auVar34._0_16_,
                                auVar33._0_16_);
      auVar52 = vpmaxsd_avx(auVar52,auVar42._0_16_);
      auVar8 = vpmaxsd_avx(auVar8,auVar52);
      auVar52 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar12 + 0x20 + (uVar19 ^ 0x10)),
                                auVar35._0_16_,auVar28._0_16_);
      auVar55 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar12 + 0x20 + (uVar21 ^ 0x10)),
                                auVar37._0_16_,auVar31._0_16_);
      auVar52 = vpminsd_avx(auVar52,auVar55);
      auVar55 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar12 + 0x20 + (uVar20 ^ 0x10)),
                                auVar34._0_16_,auVar33._0_16_);
      auVar55 = vpminsd_avx(auVar55,auVar47._0_16_);
      auVar52 = vpminsd_avx(auVar52,auVar55);
      auVar8 = vpcmpgtd_avx(auVar8,auVar52);
      iVar10 = vmovmskps_avx(auVar8);
      if (iVar10 == 0xf) goto LAB_015de97d;
      bVar9 = (byte)iVar10 ^ 0xf;
      uVar11 = uVar12 & 0xfffffffffffffff0;
      lVar17 = 0;
      for (uVar12 = (ulong)bVar9; (uVar12 & 1) == 0; uVar12 = uVar12 >> 1 | 0x8000000000000000) {
        lVar17 = lVar17 + 1;
      }
      uVar12 = *(ulong *)(uVar11 + lVar17 * 8);
      uVar15 = bVar9 - 1 & (uint)bVar9;
      uVar16 = (ulong)uVar15;
      if (uVar15 != 0) {
        do {
          *local_b78 = uVar12;
          local_b78 = local_b78 + 1;
          lVar17 = 0;
          for (uVar12 = uVar16; (uVar12 & 1) == 0; uVar12 = uVar12 >> 1 | 0x8000000000000000) {
            lVar17 = lVar17 + 1;
          }
          uVar16 = uVar16 - 1 & uVar16;
          uVar12 = *(ulong *)(uVar11 + lVar17 * 8);
        } while (uVar16 != 0);
      }
    }
    uVar11 = uVar12 & 0xfffffffffffffff0;
    for (lVar17 = 0; lVar17 != (ulong)((uint)uVar12 & 0xf) - 8; lVar17 = lVar17 + 1) {
      lVar13 = lVar17 * 0xb0;
      auVar8 = *(undefined1 (*) [16])(uVar11 + 0x80 + lVar13);
      auVar52 = *(undefined1 (*) [16])(uVar11 + 0x40 + lVar13);
      auVar55 = *(undefined1 (*) [16])(uVar11 + 0x70 + lVar13);
      auVar41 = *(undefined1 (*) [16])(uVar11 + 0x50 + lVar13);
      auVar22._0_4_ = auVar8._0_4_ * auVar52._0_4_;
      auVar22._4_4_ = auVar8._4_4_ * auVar52._4_4_;
      auVar22._8_4_ = auVar8._8_4_ * auVar52._8_4_;
      auVar22._12_4_ = auVar8._12_4_ * auVar52._12_4_;
      local_970 = vfmsub231ps_fma(auVar22,auVar55,auVar41);
      auVar22 = *(undefined1 (*) [16])(uVar11 + 0x60 + lVar13);
      auVar27 = *(undefined1 (*) [16])(uVar11 + 0x30 + lVar13);
      auVar24._0_4_ = auVar41._0_4_ * auVar22._0_4_;
      auVar24._4_4_ = auVar41._4_4_ * auVar22._4_4_;
      auVar24._8_4_ = auVar41._8_4_ * auVar22._8_4_;
      auVar24._12_4_ = auVar41._12_4_ * auVar22._12_4_;
      local_960 = vfmsub231ps_fma(auVar24,auVar8,auVar27);
      uVar1 = *(undefined4 *)(ray + k * 4);
      auVar48._4_4_ = uVar1;
      auVar48._0_4_ = uVar1;
      auVar48._8_4_ = uVar1;
      auVar48._12_4_ = uVar1;
      auVar24 = vsubps_avx(*(undefined1 (*) [16])(uVar11 + lVar13),auVar48);
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar49._4_4_ = uVar1;
      auVar49._0_4_ = uVar1;
      auVar49._8_4_ = uVar1;
      auVar49._12_4_ = uVar1;
      auVar48 = vsubps_avx(*(undefined1 (*) [16])(uVar11 + 0x10 + lVar13),auVar49);
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x40);
      auVar50._4_4_ = uVar1;
      auVar50._0_4_ = uVar1;
      auVar50._8_4_ = uVar1;
      auVar50._12_4_ = uVar1;
      auVar49 = vsubps_avx(*(undefined1 (*) [16])(uVar11 + 0x20 + lVar13),auVar50);
      fVar36 = *(float *)(ray + k * 4 + 0x80);
      auVar51._4_4_ = fVar36;
      auVar51._0_4_ = fVar36;
      auVar51._8_4_ = fVar36;
      auVar51._12_4_ = fVar36;
      fVar38 = *(float *)(ray + k * 4 + 0xa0);
      auVar53._4_4_ = fVar38;
      auVar53._0_4_ = fVar38;
      auVar53._8_4_ = fVar38;
      auVar53._12_4_ = fVar38;
      fVar39 = *(float *)(ray + k * 4 + 0xc0);
      auVar54._4_4_ = fVar39;
      auVar54._0_4_ = fVar39;
      auVar54._8_4_ = fVar39;
      auVar54._12_4_ = fVar39;
      auVar56._0_4_ = fVar36 * auVar48._0_4_;
      auVar56._4_4_ = fVar36 * auVar48._4_4_;
      auVar56._8_4_ = fVar36 * auVar48._8_4_;
      auVar56._12_4_ = fVar36 * auVar48._12_4_;
      auVar32 = vfmsub231ps_fma(auVar56,auVar24,auVar53);
      auVar46._0_4_ = auVar8._0_4_ * auVar32._0_4_;
      auVar46._4_4_ = auVar8._4_4_ * auVar32._4_4_;
      auVar46._8_4_ = auVar8._8_4_ * auVar32._8_4_;
      auVar46._12_4_ = auVar8._12_4_ * auVar32._12_4_;
      auVar57._0_4_ = auVar41._0_4_ * auVar32._0_4_;
      auVar57._4_4_ = auVar41._4_4_ * auVar32._4_4_;
      auVar57._8_4_ = auVar41._8_4_ * auVar32._8_4_;
      auVar57._12_4_ = auVar41._12_4_ * auVar32._12_4_;
      auVar41._0_4_ = fVar39 * auVar24._0_4_;
      auVar41._4_4_ = fVar39 * auVar24._4_4_;
      auVar41._8_4_ = fVar39 * auVar24._8_4_;
      auVar41._12_4_ = fVar39 * auVar24._12_4_;
      auVar41 = vfmsub231ps_fma(auVar41,auVar49,auVar51);
      auVar8 = vfmadd231ps_fma(auVar46,auVar41,auVar55);
      auVar41 = vfmadd231ps_fma(auVar57,auVar52,auVar41);
      auVar32._0_4_ = auVar27._0_4_ * auVar55._0_4_;
      auVar32._4_4_ = auVar27._4_4_ * auVar55._4_4_;
      auVar32._8_4_ = auVar27._8_4_ * auVar55._8_4_;
      auVar32._12_4_ = auVar27._12_4_ * auVar55._12_4_;
      local_950 = vfmsub231ps_fma(auVar32,auVar22,auVar52);
      auVar58._0_4_ = fVar38 * auVar49._0_4_;
      auVar58._4_4_ = fVar38 * auVar49._4_4_;
      auVar58._8_4_ = fVar38 * auVar49._8_4_;
      auVar58._12_4_ = fVar38 * auVar49._12_4_;
      auVar32 = vfmsub231ps_fma(auVar58,auVar48,auVar54);
      auVar55._0_4_ = fVar39 * local_950._0_4_;
      auVar55._4_4_ = fVar39 * local_950._4_4_;
      auVar55._8_4_ = fVar39 * local_950._8_4_;
      auVar55._12_4_ = fVar39 * local_950._12_4_;
      auVar52 = vfmadd231ps_fma(auVar55,local_960,auVar53);
      auVar55 = vfmadd231ps_fma(auVar52,local_970,auVar51);
      auVar52 = vfmadd231ps_fma(auVar8,auVar32,auVar22);
      auVar8._4_4_ = uStack_a0c;
      auVar8._0_4_ = local_a10;
      auVar8._8_4_ = uStack_a08;
      auVar8._12_4_ = uStack_a04;
      auVar8 = vandps_avx(auVar55,auVar8);
      uVar15 = auVar8._0_4_;
      local_a00._0_4_ = (float)(uVar15 ^ auVar52._0_4_);
      uVar43 = auVar8._4_4_;
      local_a00._4_4_ = (float)(uVar43 ^ auVar52._4_4_);
      uVar44 = auVar8._8_4_;
      local_a00._8_4_ = (float)(uVar44 ^ auVar52._8_4_);
      uVar45 = auVar8._12_4_;
      local_a00._12_4_ = (float)(uVar45 ^ auVar52._12_4_);
      auVar8 = vfmadd231ps_fma(auVar41,auVar27,auVar32);
      local_9f0._0_4_ = (float)(uVar15 ^ auVar8._0_4_);
      local_9f0._4_4_ = (float)(uVar43 ^ auVar8._4_4_);
      local_9f0._8_4_ = (float)(uVar44 ^ auVar8._8_4_);
      local_9f0._12_4_ = (float)(uVar45 ^ auVar8._12_4_);
      auVar41 = ZEXT416(0) << 0x20;
      auVar8 = vcmpps_avx(local_a00,auVar41,5);
      auVar52 = vcmpps_avx(local_9f0,auVar41,5);
      auVar8 = vandps_avx(auVar8,auVar52);
      local_9d0 = vandps_avx(auVar55,local_a20);
      auVar52 = vcmpps_avx(auVar55,auVar41,4);
      auVar8 = vandps_avx(auVar8,auVar52);
      auVar52._0_4_ = local_a00._0_4_ + local_9f0._0_4_;
      auVar52._4_4_ = local_a00._4_4_ + local_9f0._4_4_;
      auVar52._8_4_ = local_a00._8_4_ + local_9f0._8_4_;
      auVar52._12_4_ = local_a00._12_4_ + local_9f0._12_4_;
      auVar52 = vcmpps_avx(auVar52,local_9d0,2);
      auVar55 = auVar52 & auVar8;
      if ((((auVar55 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar55 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar55 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar55[0xf] < '\0'
         ) {
        auVar8 = vandps_avx(auVar8,auVar52);
        auVar29._0_4_ = local_950._0_4_ * auVar49._0_4_;
        auVar29._4_4_ = local_950._4_4_ * auVar49._4_4_;
        auVar29._8_4_ = local_950._8_4_ * auVar49._8_4_;
        auVar29._12_4_ = local_950._12_4_ * auVar49._12_4_;
        auVar52 = vfmadd213ps_fma(auVar48,local_960,auVar29);
        auVar52 = vfmadd213ps_fma(auVar24,local_970,auVar52);
        local_9e0._0_4_ = (float)(uVar15 ^ auVar52._0_4_);
        local_9e0._4_4_ = (float)(uVar43 ^ auVar52._4_4_);
        local_9e0._8_4_ = (float)(uVar44 ^ auVar52._8_4_);
        local_9e0._12_4_ = (float)(uVar45 ^ auVar52._12_4_);
        fVar36 = *(float *)(ray + k * 4 + 0x60);
        auVar27._0_4_ = local_9d0._0_4_ * fVar36;
        auVar27._4_4_ = local_9d0._4_4_ * fVar36;
        auVar27._8_4_ = local_9d0._8_4_ * fVar36;
        auVar27._12_4_ = local_9d0._12_4_ * fVar36;
        auVar52 = vcmpps_avx(auVar27,local_9e0,1);
        fVar36 = *(float *)(ray + k * 4 + 0x100);
        auVar28 = ZEXT1664(CONCAT412(fVar36,CONCAT48(fVar36,CONCAT44(fVar36,fVar36))));
        auVar30._0_4_ = local_9d0._0_4_ * fVar36;
        auVar30._4_4_ = local_9d0._4_4_ * fVar36;
        auVar30._8_4_ = local_9d0._8_4_ * fVar36;
        auVar30._12_4_ = local_9d0._12_4_ * fVar36;
        auVar55 = vcmpps_avx(local_9e0,auVar30,2);
        auVar52 = vandps_avx(auVar52,auVar55);
        local_9b0 = vandps_avx(auVar8,auVar52);
        uVar15 = vmovmskps_avx(local_9b0);
        if (uVar15 != 0) {
          pSVar3 = context->scene;
          auVar8 = vrcpps_avx(local_9d0);
          auVar25._8_4_ = 0x3f800000;
          auVar25._0_8_ = 0x3f8000003f800000;
          auVar25._12_4_ = 0x3f800000;
          auVar52 = vfnmadd213ps_fma(local_9d0,auVar8,auVar25);
          auVar8 = vfmadd132ps_fma(auVar52,auVar8,auVar8);
          fVar36 = auVar8._0_4_;
          fVar38 = auVar8._4_4_;
          fVar39 = auVar8._8_4_;
          fVar40 = auVar8._12_4_;
          local_980[0] = fVar36 * local_9e0._0_4_;
          local_980[1] = fVar38 * local_9e0._4_4_;
          local_980[2] = fVar39 * local_9e0._8_4_;
          local_980[3] = fVar40 * local_9e0._12_4_;
          local_9a0[0] = fVar36 * local_a00._0_4_;
          local_9a0[1] = fVar38 * local_a00._4_4_;
          local_9a0[2] = fVar39 * local_a00._8_4_;
          local_9a0[3] = fVar40 * local_a00._12_4_;
          local_990._0_4_ = fVar36 * local_9f0._0_4_;
          local_990._4_4_ = fVar38 * local_9f0._4_4_;
          local_990._8_4_ = fVar39 * local_9f0._8_4_;
          local_990._12_4_ = fVar40 * local_9f0._12_4_;
          uVar16 = (ulong)(uVar15 & 0xff);
          do {
            local_ab0 = auVar28._0_16_;
            uVar7 = 0;
            for (uVar14 = uVar16; (uVar14 & 1) == 0; uVar14 = uVar14 >> 1 | 0x8000000000000000) {
              uVar7 = uVar7 + 1;
            }
            uVar15 = *(uint *)(lVar13 + uVar11 + 0x90 + uVar7 * 4);
            pGVar4 = (pSVar3->geometries).items[uVar15].ptr;
            if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                uVar14 = (ulong)(uint)((int)uVar7 * 4);
                uVar1 = *(undefined4 *)((long)local_9a0 + uVar14);
                local_8c0._4_4_ = uVar1;
                local_8c0._0_4_ = uVar1;
                local_8c0._8_4_ = uVar1;
                local_8c0._12_4_ = uVar1;
                local_8c0._16_4_ = uVar1;
                local_8c0._20_4_ = uVar1;
                local_8c0._24_4_ = uVar1;
                local_8c0._28_4_ = uVar1;
                local_8a0 = *(undefined4 *)(local_990 + uVar14);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)((long)local_980 + uVar14);
                local_b10.context = context->user;
                uVar1 = *(undefined4 *)(lVar13 + uVar11 + 0xa0 + uVar14);
                local_880._4_4_ = uVar1;
                local_880._0_4_ = uVar1;
                local_880._8_4_ = uVar1;
                local_880._12_4_ = uVar1;
                local_880._16_4_ = uVar1;
                local_880._20_4_ = uVar1;
                local_880._24_4_ = uVar1;
                local_880._28_4_ = uVar1;
                uVar1 = *(undefined4 *)(local_970 + uVar14);
                uVar2 = *(undefined4 *)(local_960 + uVar14);
                local_900._4_4_ = uVar2;
                local_900._0_4_ = uVar2;
                local_900._8_4_ = uVar2;
                local_900._12_4_ = uVar2;
                local_900._16_4_ = uVar2;
                local_900._20_4_ = uVar2;
                local_900._24_4_ = uVar2;
                local_900._28_4_ = uVar2;
                uVar2 = *(undefined4 *)(local_950 + uVar14);
                local_8e0._4_4_ = uVar2;
                local_8e0._0_4_ = uVar2;
                local_8e0._8_4_ = uVar2;
                local_8e0._12_4_ = uVar2;
                local_8e0._16_4_ = uVar2;
                local_8e0._20_4_ = uVar2;
                local_8e0._24_4_ = uVar2;
                local_8e0._28_4_ = uVar2;
                local_860._4_4_ = uVar15;
                local_860._0_4_ = uVar15;
                local_860._8_4_ = uVar15;
                local_860._12_4_ = uVar15;
                local_860._16_4_ = uVar15;
                local_860._20_4_ = uVar15;
                local_860._24_4_ = uVar15;
                local_860._28_4_ = uVar15;
                local_920[0] = (RTCHitN)(char)uVar1;
                local_920[1] = (RTCHitN)(char)((uint)uVar1 >> 8);
                local_920[2] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                local_920[3] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                local_920[4] = (RTCHitN)(char)uVar1;
                local_920[5] = (RTCHitN)(char)((uint)uVar1 >> 8);
                local_920[6] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                local_920[7] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                local_920[8] = (RTCHitN)(char)uVar1;
                local_920[9] = (RTCHitN)(char)((uint)uVar1 >> 8);
                local_920[10] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                local_920[0xb] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                local_920[0xc] = (RTCHitN)(char)uVar1;
                local_920[0xd] = (RTCHitN)(char)((uint)uVar1 >> 8);
                local_920[0xe] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                local_920[0xf] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                local_920[0x10] = (RTCHitN)(char)uVar1;
                local_920[0x11] = (RTCHitN)(char)((uint)uVar1 >> 8);
                local_920[0x12] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                local_920[0x13] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                local_920[0x14] = (RTCHitN)(char)uVar1;
                local_920[0x15] = (RTCHitN)(char)((uint)uVar1 >> 8);
                local_920[0x16] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                local_920[0x17] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                local_920[0x18] = (RTCHitN)(char)uVar1;
                local_920[0x19] = (RTCHitN)(char)((uint)uVar1 >> 8);
                local_920[0x1a] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                local_920[0x1b] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                local_920[0x1c] = (RTCHitN)(char)uVar1;
                local_920[0x1d] = (RTCHitN)(char)((uint)uVar1 >> 8);
                local_920[0x1e] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                local_920[0x1f] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                uStack_89c = local_8a0;
                uStack_898 = local_8a0;
                uStack_894 = local_8a0;
                uStack_890 = local_8a0;
                uStack_88c = local_8a0;
                uStack_888 = local_8a0;
                uStack_884 = local_8a0;
                vpcmpeqd_avx2(local_8c0,local_8c0);
                uStack_83c = (local_b10.context)->instID[0];
                local_840 = uStack_83c;
                uStack_838 = uStack_83c;
                uStack_834 = uStack_83c;
                uStack_830 = uStack_83c;
                uStack_82c = uStack_83c;
                uStack_828 = uStack_83c;
                uStack_824 = uStack_83c;
                uStack_81c = (local_b10.context)->instPrimID[0];
                local_820 = uStack_81c;
                uStack_818 = uStack_81c;
                uStack_814 = uStack_81c;
                uStack_810 = uStack_81c;
                uStack_80c = uStack_81c;
                uStack_808 = uStack_81c;
                uStack_804 = uStack_81c;
                local_ae0 = local_940;
                local_b10.valid = (int *)local_ae0;
                local_b10.geometryUserPtr = pGVar4->userPtr;
                local_b10.hit = local_920;
                local_b10.N = 8;
                local_b10.ray = (RTCRayN *)ray;
                if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar4->occlusionFilterN)(&local_b10);
                }
                auVar6 = vpcmpeqd_avx2(local_ae0,_DAT_01f7b000);
                auVar23 = _DAT_01f7b020 & ~auVar6;
                if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar23 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar23 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar23 >> 0x7f,0) == '\0') &&
                      (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar23 >> 0xbf,0) == '\0') &&
                    (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar23[0x1f]) {
                  auVar6 = auVar6 ^ _DAT_01f7b020;
                }
                else {
                  p_Var5 = context->args->filter;
                  if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    (*p_Var5)(&local_b10);
                  }
                  auVar23 = vpcmpeqd_avx2(local_ae0,_DAT_01f7b000);
                  auVar6 = auVar23 ^ _DAT_01f7b020;
                  auVar26._8_4_ = 0xff800000;
                  auVar26._0_8_ = 0xff800000ff800000;
                  auVar26._12_4_ = 0xff800000;
                  auVar26._16_4_ = 0xff800000;
                  auVar26._20_4_ = 0xff800000;
                  auVar26._24_4_ = 0xff800000;
                  auVar26._28_4_ = 0xff800000;
                  auVar23 = vblendvps_avx(auVar26,*(undefined1 (*) [32])(local_b10.ray + 0x100),
                                          auVar23);
                  *(undefined1 (*) [32])(local_b10.ray + 0x100) = auVar23;
                }
                if ((((((((auVar6 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar6 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar6 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar6 >> 0x7f,0) == '\0') &&
                      (auVar6 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar6 >> 0xbf,0) == '\0') &&
                    (auVar6 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar6[0x1f]) {
                  auVar28 = ZEXT1664(local_ab0);
                  *(int *)(ray + k * 4 + 0x100) = local_ab0._0_4_;
                  goto LAB_015def10;
                }
              }
              *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
              goto LAB_015deffd;
            }
LAB_015def10:
            uVar16 = uVar16 ^ 1L << (uVar7 & 0x3f);
          } while (uVar16 != 0);
        }
      }
      auVar28 = ZEXT1664(local_a30);
      auVar31 = ZEXT1664(local_a40);
      auVar33 = ZEXT1664(local_a50);
      auVar35 = ZEXT1664(local_a60);
      auVar37 = ZEXT1664(local_a70);
      auVar34 = ZEXT1664(local_a80);
      auVar42 = ZEXT1664(local_a90);
      auVar47 = ZEXT1664(local_aa0);
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }